

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall
mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,IdentifierExpr *node)

{
  element_type *peVar1;
  int iVar2;
  mapped_type *pmVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *local_18;
  
  iVar2 = std::__cxx11::string::compare
                    ((char *)&((node->identifier).
                               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->val);
  if (iVar2 != 0) {
    local_18 = (node->identifier).
               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pmVar3 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this->associatedDecl,(key_type *)&local_18);
    peVar1 = (pmVar3->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(peVar1,&ast::Declaration::typeinfo,&ast::VarDecl::typeinfo,0);
    }
    if (lVar4 == 0) {
      lVar4 = 0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (pmVar3->super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    if (lVar4 == 0) {
      __assert_fail("decl",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/preprocessor.cpp"
                    ,0x74,
                    "virtual void mocker::RenameASTIdentifiers::operator()(ast::IdentifierExpr &) const"
                   );
    }
    std::__cxx11::string::_M_assign
              ((string *)
               &((node->identifier).
                 super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                val);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return;
}

Assistant:

void operator()(ast::IdentifierExpr &node) const override {
    if (node.identifier->val == "this")
      return;
    auto decl = std::dynamic_pointer_cast<ast::VarDecl>(
        associatedDecl.at(node.identifier->getID()));
    assert(decl);
    node.identifier->val = decl->decl->identifier->val;
  }